

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spe-impl.inc.c
# Opt level: O1

void gen_evcmpeq_speundef(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGv_i64 pTVar1;
  TCGv_i32 pTVar2;
  TCGLabel *l;
  TCGLabel *a1;
  TCGLabel *l_00;
  TCGLabel *a1_00;
  
  if ((ctx->opcode & 1) != 0) {
    gen_exception_err(ctx,0x60,0x21);
    return;
  }
  if (ctx->spe_enabled != false) {
    s = ctx->uc->tcg_ctx;
    l = gen_new_label_ppc64(s);
    a1 = gen_new_label_ppc64(s);
    l_00 = gen_new_label_ppc64(s);
    a1_00 = gen_new_label_ppc64(s);
    tcg_gen_ext32s_i64_ppc64
              (s,cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f],
               cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f]);
    pTVar1 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
    tcg_gen_ext32s_i64_ppc64(s,pTVar1,pTVar1);
    tcg_gen_ext32s_i64_ppc64
              (s,cpu_gprh[*(ushort *)((long)&ctx->opcode + 2) & 0x1f],
               cpu_gprh[*(ushort *)((long)&ctx->opcode + 2) & 0x1f]);
    pTVar1 = *(TCGv_i64 *)((long)cpu_gprh + (ulong)(ctx->opcode >> 8 & 0xf8));
    tcg_gen_ext32s_i64_ppc64(s,pTVar1,pTVar1);
    tcg_gen_brcond_i64_ppc64
              (s,TCG_COND_EQ,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)),
               *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)),l);
    tcg_gen_op2_ppc64(s,INDEX_op_movi_i32,
                      (long)&s->pool_cur +
                      *(long *)((long)cpu_crf + (ulong)(ctx->opcode >> 0x14 & 0x38)),0);
    *(short *)&a1->field_0x2 = (short)((uint)*(ushort *)&a1->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_ppc64(s,INDEX_op_br,(TCGArg)a1);
    *(byte *)l = *(byte *)l | 1;
    tcg_gen_op1_ppc64(s,INDEX_op_set_label,(TCGArg)l);
    tcg_gen_op2_ppc64(s,INDEX_op_movi_i32,
                      (long)&s->pool_cur +
                      *(long *)((long)cpu_crf + (ulong)(ctx->opcode >> 0x14 & 0x38)),7);
    *(byte *)a1 = *(byte *)a1 | 1;
    tcg_gen_op1_ppc64(s,INDEX_op_set_label,(TCGArg)a1);
    tcg_gen_brcond_i64_ppc64
              (s,TCG_COND_EQ,*(TCGv_i64 *)((long)cpu_gprh + (ulong)(ctx->opcode >> 0xd & 0xf8)),
               *(TCGv_i64 *)((long)cpu_gprh + (ulong)(ctx->opcode >> 8 & 0xf8)),l_00);
    pTVar2 = *(TCGv_i32 *)((long)cpu_crf + (ulong)(ctx->opcode >> 0x14 & 0x38));
    tcg_gen_andi_i32_ppc64(s,pTVar2,pTVar2,-10);
    *(short *)&a1_00->field_0x2 =
         (short)((uint)*(ushort *)&a1_00->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_ppc64(s,INDEX_op_br,(TCGArg)a1_00);
    *(byte *)l_00 = *(byte *)l_00 | 1;
    tcg_gen_op1_ppc64(s,INDEX_op_set_label,(TCGArg)l_00);
    pTVar2 = *(TCGv_i32 *)((long)cpu_crf + (ulong)(ctx->opcode >> 0x14 & 0x38));
    tcg_gen_ori_i32_ppc64(s,pTVar2,pTVar2,10);
    *(byte *)a1_00 = *(byte *)a1_00 | 1;
    tcg_gen_op1_ppc64(s,INDEX_op_set_label,(TCGArg)a1_00);
    return;
  }
  gen_exception(ctx,0x20);
  return;
}

Assistant:

static inline void gen_addr_spe_imm_index(DisasContext *ctx, TCGv EA, int sh)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong uimm = rB(ctx->opcode);

    if (rA(ctx->opcode) == 0) {
        tcg_gen_movi_tl(tcg_ctx, EA, uimm << sh);
    } else {
        tcg_gen_addi_tl(tcg_ctx, EA, cpu_gpr[rA(ctx->opcode)], uimm << sh);
        if (NARROW_MODE(ctx)) {
            tcg_gen_ext32u_tl(tcg_ctx, EA, EA);
        }
    }
}